

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

int Rml::Math::ToPowerOfTwo(int number)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  if ((number & number - 1U) != 0) {
    uVar2 = 0x1f;
    do {
      if (((uint)number >> (uVar2 & 0x1f) & 1) != 0) {
        iVar1 = -0x80000000;
        if (uVar2 != 0x1f) {
          iVar1 = 2 << ((byte)uVar2 & 0x1f);
        }
        return iVar1;
      }
      bVar3 = uVar2 != 0;
      uVar2 = uVar2 - 1;
    } while (bVar3);
    number = 0;
  }
  return number;
}

Assistant:

RMLUICORE_API int ToPowerOfTwo(int number)
	{
		// Check if the number is already a power of two.
		if ((number & (number - 1)) == 0)
			return number;

		// Assuming 31 useful bits in an int here ... !
		for (int i = 31; i >= 0; i--)
		{
			if (number & (1 << i))
			{
				if (i == 31)
					return 1 << 31;
				else
					return 1 << (i + 1);
			}
		}

		return 0;
	}